

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Text.cpp
# Opt level: O0

void anon_unknown.dwarf_11b89d::addLine
               (VertexArray *vertices,float lineLength,float lineTop,Color *color,float offset,
               float thickness,float outlineThickness)

{
  Color *pCVar1;
  Color *in_RSI;
  float in_XMM0_Da;
  float fVar2;
  double dVar3;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float bottom;
  float top;
  Vertex *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  Vector2<float> local_104;
  Vector2<float> local_fc;
  Vertex local_f4;
  Vector2<float> local_e0;
  Vector2<float> local_d8;
  Vertex local_d0;
  Vector2<float> local_bc;
  Vector2<float> local_b4;
  Vertex local_ac;
  Vector2<float> local_98;
  Vector2<float> local_90;
  Vertex local_88;
  Vector2<float> local_74;
  Vector2<float> local_6c;
  Vertex local_64;
  Vector2<float> local_50;
  Vector2<float> local_48;
  Vertex local_40;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  Color *local_18;
  float local_c;
  
  local_24 = in_XMM4_Da;
  local_20 = in_XMM3_Da;
  local_18 = in_RSI;
  local_c = in_XMM0_Da;
  dVar3 = std::floor((double)(ulong)(uint)(((in_XMM1_Da + in_XMM2_Da) - in_XMM3_Da / 2.0) + 0.5));
  fVar2 = SUB84(dVar3,0);
  local_28 = fVar2;
  dVar3 = std::floor((double)(ulong)(uint)(local_20 + 0.5));
  local_2c = fVar2 + SUB84(dVar3,0);
  sf::Vector2<float>::Vector2(&local_48,-local_24,local_28 - local_24);
  pCVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_50,1.0,1.0);
  sf::Vertex::Vertex(&local_40,&local_48,pCVar1,&local_50);
  sf::VertexArray::append
            ((VertexArray *)CONCAT44(fVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  sf::Vector2<float>::Vector2(&local_6c,local_c + local_24,local_28 - local_24);
  pCVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_74,1.0,1.0);
  sf::Vertex::Vertex(&local_64,&local_6c,pCVar1,&local_74);
  sf::VertexArray::append
            ((VertexArray *)CONCAT44(fVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  sf::Vector2<float>::Vector2(&local_90,-local_24,local_2c + local_24);
  pCVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_98,1.0,1.0);
  sf::Vertex::Vertex(&local_88,&local_90,pCVar1,&local_98);
  sf::VertexArray::append
            ((VertexArray *)CONCAT44(fVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  sf::Vector2<float>::Vector2(&local_b4,-local_24,local_2c + local_24);
  pCVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_bc,1.0,1.0);
  sf::Vertex::Vertex(&local_ac,&local_b4,pCVar1,&local_bc);
  sf::VertexArray::append
            ((VertexArray *)CONCAT44(fVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  sf::Vector2<float>::Vector2(&local_d8,local_c + local_24,local_28 - local_24);
  pCVar1 = local_18;
  sf::Vector2<float>::Vector2(&local_e0,1.0,1.0);
  sf::Vertex::Vertex(&local_d0,&local_d8,pCVar1,&local_e0);
  sf::VertexArray::append
            ((VertexArray *)CONCAT44(fVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  sf::Vector2<float>::Vector2(&local_fc,local_c + local_24,local_2c + local_24);
  sf::Vector2<float>::Vector2(&local_104,1.0,1.0);
  sf::Vertex::Vertex(&local_f4,&local_fc,local_18,&local_104);
  sf::VertexArray::append
            ((VertexArray *)CONCAT44(fVar2,in_stack_fffffffffffffe90),in_stack_fffffffffffffe88);
  return;
}

Assistant:

void addLine(sf::VertexArray& vertices, float lineLength, float lineTop, const sf::Color& color, float offset, float thickness, float outlineThickness = 0)
    {
        float top = std::floor(lineTop + offset - (thickness / 2) + 0.5f);
        float bottom = top + std::floor(thickness + 0.5f);

        vertices.append(sf::Vertex(sf::Vector2f(-outlineThickness,             top    - outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(lineLength + outlineThickness, top    - outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(-outlineThickness,             bottom + outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(-outlineThickness,             bottom + outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(lineLength + outlineThickness, top    - outlineThickness), color, sf::Vector2f(1, 1)));
        vertices.append(sf::Vertex(sf::Vector2f(lineLength + outlineThickness, bottom + outlineThickness), color, sf::Vector2f(1, 1)));
    }